

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall
Js::DebuggerScope::TryGetValidProperty
          (DebuggerScope *this,PropertyId propertyId,RegSlot location,int offset,
          DebuggerScopeProperty *outScopeProperty,bool *isInDeadZone)

{
  bool bVar1;
  
  bVar1 = TryGetProperty(this,propertyId,location,outScopeProperty);
  if ((bVar1) && (bVar1 = IsOffsetInScope(this,offset), bVar1)) {
    if (isInDeadZone == (bool *)0x0) {
      return true;
    }
    bVar1 = DebuggerScopeProperty::IsInDeadZone(outScopeProperty,offset);
    *isInDeadZone = bVar1;
    return true;
  }
  return false;
}

Assistant:

bool DebuggerScope::TryGetValidProperty(Js::PropertyId propertyId, RegSlot location, int offset, DebuggerScopeProperty* outScopeProperty, bool* isInDeadZone) const
    {
        if (TryGetProperty(propertyId, location, outScopeProperty))
        {
            if (IsOffsetInScope(offset))
            {
                if (isInDeadZone != nullptr)
                {
                    *isInDeadZone = outScopeProperty->IsInDeadZone(offset);
                }

                return true;
            }
        }

        return false;
    }